

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

Curl_addrinfo * doh2ai(dohentry *de,char *hostname,int port)

{
  in_addr_t iVar1;
  undefined8 uVar2;
  curl_socklen_t cVar3;
  uint16_t uVar4;
  Curl_addrinfo *pCVar5;
  char *pcVar6;
  sockaddr *psVar7;
  ushort local_62;
  unsigned_short addrtype;
  size_t ss_size;
  int i;
  CURLcode result;
  sockaddr_in6 *addr6;
  sockaddr_in *addr;
  Curl_addrinfo *firstai;
  Curl_addrinfo *prevai;
  Curl_addrinfo *ai;
  int port_local;
  char *hostname_local;
  dohentry *de_local;
  
  firstai = (Curl_addrinfo *)0x0;
  addr = (sockaddr_in *)0x0;
  ss_size._4_4_ = 0;
  if (de == (dohentry *)0x0) {
    de_local = (dohentry *)0x0;
  }
  else {
    for (ss_size._0_4_ = 0; (int)ss_size < de->numaddr; ss_size._0_4_ = (int)ss_size + 1) {
      if (de->addr[(int)ss_size].type == 0x1c) {
        cVar3 = 0x1c;
        local_62 = 10;
      }
      else {
        cVar3 = 0x10;
        local_62 = 2;
      }
      pCVar5 = (Curl_addrinfo *)(*Curl_ccalloc)(1,0x30);
      if (pCVar5 == (Curl_addrinfo *)0x0) {
        ss_size._4_4_ = 0x1b;
        break;
      }
      pcVar6 = (*Curl_cstrdup)(hostname);
      pCVar5->ai_canonname = pcVar6;
      if (pCVar5->ai_canonname == (char *)0x0) {
        ss_size._4_4_ = 0x1b;
        (*Curl_cfree)(pCVar5);
        break;
      }
      psVar7 = (sockaddr *)(*Curl_ccalloc)(1,(size_t)cVar3);
      pCVar5->ai_addr = psVar7;
      if (pCVar5->ai_addr == (sockaddr *)0x0) {
        ss_size._4_4_ = 0x1b;
        (*Curl_cfree)(pCVar5->ai_canonname);
        (*Curl_cfree)(pCVar5);
        break;
      }
      if (addr == (sockaddr_in *)0x0) {
        addr = (sockaddr_in *)pCVar5;
      }
      if (firstai != (Curl_addrinfo *)0x0) {
        firstai->ai_next = pCVar5;
      }
      ((in_addr *)&pCVar5->ai_family)->s_addr = (uint)local_62;
      pCVar5->ai_socktype = 1;
      pCVar5->ai_addrlen = cVar3;
      iVar1 = ((in_addr *)&pCVar5->ai_family)->s_addr;
      if (iVar1 == 2) {
        psVar7 = pCVar5->ai_addr;
        *(undefined4 *)(psVar7->sa_data + 2) = *(undefined4 *)&de->addr[(int)ss_size].ip;
        psVar7->sa_family = local_62;
        uVar4 = htons((uint16_t)port);
        *(uint16_t *)psVar7->sa_data = uVar4;
      }
      else if (iVar1 == 10) {
        psVar7 = pCVar5->ai_addr;
        *(undefined8 *)(psVar7->sa_data + 6) = *(undefined8 *)&de->addr[(int)ss_size].ip;
        uVar2 = *(undefined8 *)((long)&de->addr[(int)ss_size].ip + 8);
        psVar7[1].sa_family = (short)uVar2;
        psVar7[1].sa_data[0] = (char)((ulong)uVar2 >> 0x10);
        psVar7[1].sa_data[1] = (char)((ulong)uVar2 >> 0x18);
        psVar7[1].sa_data[2] = (char)((ulong)uVar2 >> 0x20);
        psVar7[1].sa_data[3] = (char)((ulong)uVar2 >> 0x28);
        psVar7[1].sa_data[4] = (char)((ulong)uVar2 >> 0x30);
        psVar7[1].sa_data[5] = (char)((ulong)uVar2 >> 0x38);
        psVar7->sa_family = local_62;
        uVar4 = htons((uint16_t)port);
        *(uint16_t *)psVar7->sa_data = uVar4;
      }
      firstai = pCVar5;
    }
    if (ss_size._4_4_ != 0) {
      Curl_freeaddrinfo((Curl_addrinfo *)addr);
      addr = (sockaddr_in *)0x0;
    }
    de_local = (dohentry *)addr;
  }
  return (Curl_addrinfo *)de_local;
}

Assistant:

static Curl_addrinfo *
doh2ai(const struct dohentry *de, const char *hostname, int port)
{
  Curl_addrinfo *ai;
  Curl_addrinfo *prevai = NULL;
  Curl_addrinfo *firstai = NULL;
  struct sockaddr_in *addr;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 *addr6;
#endif
  CURLcode result = CURLE_OK;
  int i;

  if(!de)
    /* no input == no output! */
    return NULL;

  for(i = 0; i < de->numaddr; i++) {
    size_t ss_size;
    CURL_SA_FAMILY_T addrtype;
    if(de->addr[i].type == DNS_TYPE_AAAA) {
#ifndef ENABLE_IPV6
      /* we can't handle IPv6 addresses */
      continue;
#else
      ss_size = sizeof(struct sockaddr_in6);
      addrtype = AF_INET6;
#endif
    }
    else {
      ss_size = sizeof(struct sockaddr_in);
      addrtype = AF_INET;
    }

    ai = calloc(1, sizeof(Curl_addrinfo));
    if(!ai) {
      result = CURLE_OUT_OF_MEMORY;
      break;
    }
    ai->ai_canonname = strdup(hostname);
    if(!ai->ai_canonname) {
      result = CURLE_OUT_OF_MEMORY;
      free(ai);
      break;
    }
    ai->ai_addr = calloc(1, ss_size);
    if(!ai->ai_addr) {
      result = CURLE_OUT_OF_MEMORY;
      free(ai->ai_canonname);
      free(ai);
      break;
    }

    if(!firstai)
      /* store the pointer we want to return from this function */
      firstai = ai;

    if(prevai)
      /* make the previous entry point to this */
      prevai->ai_next = ai;

    ai->ai_family = addrtype;

    /* we return all names as STREAM, so when using this address for TFTP
       the type must be ignored and conn->socktype be used instead! */
    ai->ai_socktype = SOCK_STREAM;

    ai->ai_addrlen = (curl_socklen_t)ss_size;

    /* leave the rest of the struct filled with zero */

    switch(ai->ai_family) {
    case AF_INET:
      addr = (void *)ai->ai_addr; /* storage area for this info */
      DEBUGASSERT(sizeof(struct in_addr) == sizeof(de->addr[i].ip.v4));
      memcpy(&addr->sin_addr, &de->addr[i].ip.v4, sizeof(struct in_addr));
      addr->sin_family = (CURL_SA_FAMILY_T)addrtype;
      addr->sin_port = htons((unsigned short)port);
      break;

#ifdef ENABLE_IPV6
    case AF_INET6:
      addr6 = (void *)ai->ai_addr; /* storage area for this info */
      DEBUGASSERT(sizeof(struct in6_addr) == sizeof(de->addr[i].ip.v6));
      memcpy(&addr6->sin6_addr, &de->addr[i].ip.v6, sizeof(struct in6_addr));
      addr6->sin6_family = (CURL_SA_FAMILY_T)addrtype;
      addr6->sin6_port = htons((unsigned short)port);
      break;
#endif
    }

    prevai = ai;
  }

  if(result) {
    Curl_freeaddrinfo(firstai);
    firstai = NULL;
  }

  return firstai;
}